

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::delete_obj_table(CVmObjTable *this)

{
  vm_image_ptr_page *pvVar1;
  CVmObjGlobPage *this_00;
  CVmHashTable *this_01;
  vm_image_ptr_page *__ptr;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < this->pages_used_; uVar2 = uVar2 + 1) {
    free(this->pages_[uVar2]);
  }
  free(this->pages_);
  this->gc_queue_head_ = 0;
  this->finalize_queue_head_ = 0;
  this->allocs_since_gc_ = 0;
  this->bytes_since_gc_ = 0;
  *(undefined8 *)((long)&this->page_slots_ + 4) = 0;
  *(undefined8 *)((long)&this->pages_used_ + 4) = 0;
  this->pages_ = (CVmObjPageEntry **)0x0;
  this->page_slots_ = 0;
  __ptr = this->image_ptr_head_;
  while (__ptr != (vm_image_ptr_page *)0x0) {
    pvVar1 = __ptr->next_;
    free(__ptr);
    __ptr = pvVar1;
  }
  this->image_ptr_head_ = (vm_image_ptr_page *)0x0;
  this->image_ptr_tail_ = (vm_image_ptr_page *)0x0;
  this_00 = this->globals_;
  if (this_00 != (CVmObjGlobPage *)0x0) {
    CVmObjGlobPage::~CVmObjGlobPage(this_00);
    operator_delete(this_00,0x88);
    this->globals_ = (CVmObjGlobPage *)0x0;
  }
  while (this->global_var_head_ != (vm_globalvar_t *)0x0) {
    delete_global_var(this,this->global_var_head_);
  }
  this_01 = this->post_load_init_table_;
  if (this_01 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(this_01);
  }
  operator_delete(this_01,0x20);
  this->post_load_init_table_ = (CVmHashTable *)0x0;
  return;
}

Assistant:

void CVmObjTable::delete_obj_table(VMG0_)
{
    /* delete each page we've allocated */
    for (size_t i = 0 ; i < pages_used_ ; ++i)
        t3free(pages_[i]);

    /* free the master page table */
    t3free(pages_);

    /* we no longer have any pages */
    pages_ = 0;
    page_slots_ = 0;
    pages_used_ = 0;

    /* empty out the object lists */
    first_free_ = VM_INVALID_OBJ;
    gc_queue_head_ = VM_INVALID_OBJ;
    finalize_queue_head_ = VM_INVALID_OBJ;

    /* clear the gc statistics */
    allocs_since_gc_ = 0;
    bytes_since_gc_ = 0;

    /* delete each object image data pointer page */
    for (vm_image_ptr_page *ip_page = image_ptr_head_, *ip_next = 0 ;
         ip_page != 0 ; ip_page = ip_next)
    {
        /* remember the next page (before we delete this one) */
        ip_next = ip_page->next_;

        /* delete this page */
        t3free(ip_page);
    }

    /* there's nothing left in the image data list */
    image_ptr_head_ = image_ptr_tail_ = 0;

    /* delete the linked list of globals */
    if (globals_ != 0)
    {
        delete globals_;
        globals_ = 0;
    }

    /* 
     *   delete any left-over global variables (these should always be
     *   deleted by subsystems before we get here, but this is the last
     *   chance, so clean them up manually) 
     */
    while (global_var_head_ != 0)
        delete_global_var(global_var_head_);

    /* delete the post-load initialization table */
    delete post_load_init_table_;
    post_load_init_table_ = 0;
}